

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  undefined1 *puVar1;
  int iVar2;
  char *pcVar3;
  string *psVar4;
  ulong uVar5;
  copyable *pcVar6;
  value cfg;
  service srv;
  test_app app;
  string type;
  value vStack_118;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  value local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [71];
  allocator local_79;
  value local_78;
  value local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  if (argc == 3) {
    pcVar3 = argv[1];
    strlen(pcVar3);
    pcVar3 = (char *)std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,(ulong)pcVar3);
    iVar2 = std::__cxx11::string::compare(pcVar3);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar2 != 0) goto LAB_0010ae4c;
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    cppcms::json::value::copyable::copyable(&vStack_118.d);
    cppcms::json::value::value<char[3]>(local_f0,(char (*) [3])"./");
    puVar1 = &((test_app *)local_d0)->field_0x10;
    local_d0[0] = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"views","");
    psVar4 = (string *)cppcms::json::value::operator[]((string *)&vStack_118);
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"paths","");
    uVar5 = cppcms::json::value::operator[](psVar4);
    pcVar6 = (copyable *)cppcms::json::value::operator[](uVar5);
    cppcms::json::value::copyable::operator=(pcVar6,&local_f0[0].d);
    if (local_110[0] != local_100) {
      operator_delete(local_110[0]);
    }
    if (local_d0[0] != puVar1) {
      operator_delete(local_d0[0]);
    }
    cppcms::json::value::copyable::~copyable(&local_f0[0].d);
    cppcms::json::value::value<char[12]>(local_f0,(char (*) [12])"en_US.UTF-8");
    local_d0[0] = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"localization","");
    psVar4 = (string *)cppcms::json::value::operator[]((string *)&vStack_118);
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"locales","");
    uVar5 = cppcms::json::value::operator[](psVar4);
    pcVar6 = (copyable *)cppcms::json::value::operator[](uVar5);
    cppcms::json::value::copyable::operator=(pcVar6,&local_f0[0].d);
    if (local_110[0] != local_100) {
      operator_delete(local_110[0]);
    }
    if (local_d0[0] != puVar1) {
      operator_delete(local_d0[0]);
    }
    cppcms::json::value::copyable::~copyable(&local_f0[0].d);
    std::__cxx11::string::string((string *)local_d0,argv[2],&local_79);
    cppcms::json::value::value<std::__cxx11::string>
              (&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"localization","");
    psVar4 = (string *)cppcms::json::value::operator[]((string *)&vStack_118);
    local_f0[0] = (value)local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"messages","");
    psVar4 = (string *)cppcms::json::value::operator[](psVar4);
    local_70[0] = (value)local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"paths","");
    uVar5 = cppcms::json::value::operator[](psVar4);
    pcVar6 = (copyable *)cppcms::json::value::operator[](uVar5);
    cppcms::json::value::copyable::operator=(pcVar6,&local_78.d);
    if (local_70[0] != (value)local_60) {
      operator_delete((void *)local_70[0]);
    }
    if (local_f0[0] != (value)local_e0) {
      operator_delete((void *)local_f0[0]);
    }
    if (local_110[0] != local_100) {
      operator_delete(local_110[0]);
    }
    cppcms::json::value::copyable::~copyable(&local_78.d);
    if (local_d0[0] != puVar1) {
      operator_delete(local_d0[0]);
    }
    cppcms::json::value::value<char[5]>(local_70,(char (*) [5])0x116162);
    local_d0[0] = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"localization","");
    psVar4 = (string *)cppcms::json::value::operator[]((string *)&vStack_118);
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"messages","");
    psVar4 = (string *)cppcms::json::value::operator[](psVar4);
    local_f0[0] = (value)local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"domains","");
    uVar5 = cppcms::json::value::operator[](psVar4);
    pcVar6 = (copyable *)cppcms::json::value::operator[](uVar5);
    cppcms::json::value::copyable::operator=(pcVar6,&local_70[0].d);
    if (local_f0[0] != (value)local_e0) {
      operator_delete((void *)local_f0[0]);
    }
    if (local_110[0] != local_100) {
      operator_delete(local_110[0]);
    }
    if (local_d0[0] != puVar1) {
      operator_delete(local_d0[0]);
    }
    cppcms::json::value::copyable::~copyable(&local_70[0].d);
    cppcms::json::value::value<char[8]>(local_70,(char (*) [8])0x115111);
    local_d0[0] = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"localization","");
    psVar4 = (string *)cppcms::json::value::operator[]((string *)&vStack_118);
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"messages","");
    psVar4 = (string *)cppcms::json::value::operator[](psVar4);
    local_f0[0] = (value)local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"domains","");
    uVar5 = cppcms::json::value::operator[](psVar4);
    pcVar6 = (copyable *)cppcms::json::value::operator[](uVar5);
    cppcms::json::value::copyable::operator=(pcVar6,&local_70[0].d);
    if (local_f0[0] != (value)local_e0) {
      operator_delete((void *)local_f0[0]);
    }
    if (local_110[0] != local_100) {
      operator_delete(local_110[0]);
    }
    if (local_d0[0] != puVar1) {
      operator_delete(local_d0[0]);
    }
    cppcms::json::value::copyable::~copyable(&local_70[0].d);
    if (iVar2 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Using separate header/body",0x1a);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      cppcms::json::value::value<char[14]>(local_f0,(char (*) [14])"tc_sep_skin_a");
      local_d0[0] = puVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"views","");
      psVar4 = (string *)cppcms::json::value::operator[]((string *)&vStack_118);
      local_110[0] = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"skins","");
      uVar5 = cppcms::json::value::operator[](psVar4);
      pcVar6 = (copyable *)cppcms::json::value::operator[](uVar5);
      cppcms::json::value::copyable::operator=(pcVar6,&local_f0[0].d);
      if (local_110[0] != local_100) {
        operator_delete(local_110[0]);
      }
      if (local_d0[0] != puVar1) {
        operator_delete(local_d0[0]);
      }
      cppcms::json::value::copyable::~copyable(&local_f0[0].d);
      cppcms::json::value::value<char[14]>(local_f0,(char (*) [14])"tc_sep_skin_b");
      local_d0[0] = puVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"views","");
      psVar4 = (string *)cppcms::json::value::operator[]((string *)&vStack_118);
      local_110[0] = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"skins","");
      uVar5 = cppcms::json::value::operator[](psVar4);
      pcVar6 = (copyable *)cppcms::json::value::operator[](uVar5);
      cppcms::json::value::copyable::operator=(pcVar6,&local_f0[0].d);
      if (local_110[0] != local_100) {
        operator_delete(local_110[0]);
      }
      if (local_d0[0] != puVar1) {
        operator_delete(local_d0[0]);
      }
      cppcms::json::value::copyable::~copyable(&local_f0[0].d);
      cppcms::json::value::value<char[12]>(local_f0,(char (*) [12])"tc_sep_skin");
      local_d0[0] = puVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"views","");
      psVar4 = (string *)cppcms::json::value::operator[]((string *)&vStack_118);
      local_110[0] = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"skins","");
      uVar5 = cppcms::json::value::operator[](psVar4);
      pcVar6 = (copyable *)cppcms::json::value::operator[](uVar5);
      cppcms::json::value::copyable::operator=(pcVar6,&local_f0[0].d);
      if (local_110[0] != local_100) {
        operator_delete(local_110[0]);
      }
      if (local_d0[0] != puVar1) {
        operator_delete(local_d0[0]);
      }
      cppcms::json::value::copyable::~copyable(&local_f0[0].d);
      cppcms::json::value::value<char[10]>(local_f0,(char (*) [10])"tc_plugin");
      local_d0[0] = puVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"views","");
      psVar4 = (string *)cppcms::json::value::operator[]((string *)&vStack_118);
      local_110[0] = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"skins","");
      uVar5 = cppcms::json::value::operator[](psVar4);
      pcVar6 = (copyable *)cppcms::json::value::operator[](uVar5);
      cppcms::json::value::copyable::operator=(pcVar6,&local_f0[0].d);
      if (local_110[0] != local_100) {
        operator_delete(local_110[0]);
      }
      if (local_d0[0] != puVar1) {
        operator_delete(local_d0[0]);
      }
      cppcms::json::value::copyable::~copyable(&local_f0[0].d);
      cppcms::json::value::value<char[11]>(local_f0,(char (*) [11])"tc_plugin2");
      local_d0[0] = puVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"views","");
      psVar4 = (string *)cppcms::json::value::operator[]((string *)&vStack_118);
      local_110[0] = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"skins","");
      uVar5 = cppcms::json::value::operator[](psVar4);
      pcVar6 = (copyable *)cppcms::json::value::operator[](uVar5);
      cppcms::json::value::copyable::operator=(pcVar6,&local_f0[0].d);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Using shared header/body",0x18);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      cppcms::json::value::value<char[10]>(local_f0,(char (*) [10])"tc_skin_a");
      local_d0[0] = puVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"views","");
      psVar4 = (string *)cppcms::json::value::operator[]((string *)&vStack_118);
      local_110[0] = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"skins","");
      uVar5 = cppcms::json::value::operator[](psVar4);
      pcVar6 = (copyable *)cppcms::json::value::operator[](uVar5);
      cppcms::json::value::copyable::operator=(pcVar6,&local_f0[0].d);
      if (local_110[0] != local_100) {
        operator_delete(local_110[0]);
      }
      if (local_d0[0] != puVar1) {
        operator_delete(local_d0[0]);
      }
      cppcms::json::value::copyable::~copyable(&local_f0[0].d);
      cppcms::json::value::value<char[10]>(local_f0,(char (*) [10])"tc_skin_b");
      local_d0[0] = puVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"views","");
      psVar4 = (string *)cppcms::json::value::operator[]((string *)&vStack_118);
      local_110[0] = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"skins","");
      uVar5 = cppcms::json::value::operator[](psVar4);
      pcVar6 = (copyable *)cppcms::json::value::operator[](uVar5);
      cppcms::json::value::copyable::operator=(pcVar6,&local_f0[0].d);
      if (local_110[0] != local_100) {
        operator_delete(local_110[0]);
      }
      if (local_d0[0] != puVar1) {
        operator_delete(local_d0[0]);
      }
      cppcms::json::value::copyable::~copyable(&local_f0[0].d);
      cppcms::json::value::value<char[8]>(local_f0,(char (*) [8])"tc_skin");
      local_d0[0] = puVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"views","");
      psVar4 = (string *)cppcms::json::value::operator[]((string *)&vStack_118);
      local_110[0] = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"skins","");
      uVar5 = cppcms::json::value::operator[](psVar4);
      pcVar6 = (copyable *)cppcms::json::value::operator[](uVar5);
      cppcms::json::value::copyable::operator=(pcVar6,&local_f0[0].d);
    }
    if (local_110[0] != local_100) {
      operator_delete(local_110[0]);
    }
    if (local_d0[0] != puVar1) {
      operator_delete(local_d0[0]);
    }
    cppcms::json::value::copyable::~copyable(&local_f0[0].d);
    cppcms::json::value::value<char[8]>(local_f0,(char (*) [8])"tc_skin");
    local_d0[0] = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"views","");
    psVar4 = (string *)cppcms::json::value::operator[]((string *)&vStack_118);
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"default_skin","");
    pcVar6 = (copyable *)cppcms::json::value::operator[](psVar4);
    cppcms::json::value::copyable::operator=(pcVar6,&local_f0[0].d);
    if (local_110[0] != local_100) {
      operator_delete(local_110[0]);
    }
    if (local_d0[0] != puVar1) {
      operator_delete(local_d0[0]);
    }
    cppcms::json::value::copyable::~copyable(&local_f0[0].d);
    cppcms::json::value::value<char[14]>(local_f0,(char (*) [14])"thread_shared");
    local_d0[0] = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"cache","");
    psVar4 = (string *)cppcms::json::value::operator[]((string *)&vStack_118);
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"backend","");
    pcVar6 = (copyable *)cppcms::json::value::operator[](psVar4);
    cppcms::json::value::copyable::operator=(pcVar6,&local_f0[0].d);
    if (local_110[0] != local_100) {
      operator_delete(local_110[0]);
    }
    if (local_d0[0] != puVar1) {
      operator_delete(local_d0[0]);
    }
    cppcms::json::value::copyable::~copyable(&local_f0[0].d);
    local_70[0]._0_4_ = 100;
    cppcms::json::value::value<int>(local_f0,(int *)local_70);
    local_d0[0] = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"cache","");
    psVar4 = (string *)cppcms::json::value::operator[]((string *)&vStack_118);
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"limit","");
    pcVar6 = (copyable *)cppcms::json::value::operator[](psVar4);
    cppcms::json::value::copyable::operator=(pcVar6,&local_f0[0].d);
    if (local_110[0] != local_100) {
      operator_delete(local_110[0]);
    }
    if (local_d0[0] != puVar1) {
      operator_delete(local_d0[0]);
    }
    cppcms::json::value::copyable::~copyable(&local_f0[0].d);
    cppcms::service::service((service *)local_110,&vStack_118);
    test_app::test_app((test_app *)local_d0,(service *)local_110);
    test_app::test_buffer((test_app *)local_d0);
    test_app::set_context((test_app *)local_d0);
    test_app::test_skins((test_app *)local_d0);
    test_app::test_views((test_app *)local_d0);
    test_app::test_templates((test_app *)local_d0);
    test_app::test_if((test_app *)local_d0);
    test_app::test_url((test_app *)local_d0);
    test_app::test_foreach((test_app *)local_d0);
    test_app::test_format((test_app *)local_d0);
    test_app::test_forms((test_app *)local_d0);
    test_app::test_block_filter((test_app *)local_d0);
    test_app::test_cache((test_app *)local_d0);
    test_app::test_using_render((test_app *)local_d0);
    test_app::test_gettext((test_app *)local_d0);
    if (iVar2 == 0) {
      test_app::test_using_from((test_app *)local_d0);
      test_app::test_domain((test_app *)local_d0);
    }
    test_app::~test_app((test_app *)local_d0);
    cppcms::service::~service((service *)local_110);
    cppcms::json::value::copyable::~copyable(&vStack_118.d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    iVar2 = 0;
    std::ostream::flush();
  }
  else {
LAB_0010ae4c:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Usage (--separate|--shared) /path/to/tests/dir",0x2e);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    iVar2 = 1;
    std::ostream::flush();
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return iVar2;
}

Assistant:

int main(int argc,char **argv)
{
	std::string type;
	if(argc!=3 || ((type=argv[1])!="--separate" && type!="--shared")) {
		std::cerr << "Usage (--separate|--shared) /path/to/tests/dir" << std::endl;
		return 1;
	}
	bool separate = type == "--separate";
	try {
		cppcms::json::value cfg;
		cfg["views"]["paths"][0]="./";
		cfg["localization"]["locales"][0]="en_US.UTF-8";
		cfg["localization"]["messages"]["paths"][0]=std::string(argv[2]);
		cfg["localization"]["messages"]["domains"][0]="main";
		cfg["localization"]["messages"]["domains"][1]="plugin2";

		if(separate) {
			std::cout << "Using separate header/body" << std::endl;
			cfg["views"]["skins"][0]="tc_sep_skin_a";
			cfg["views"]["skins"][1]="tc_sep_skin_b";
			cfg["views"]["skins"][2]="tc_sep_skin";
			cfg["views"]["skins"][3]="tc_plugin";
			cfg["views"]["skins"][4]="tc_plugin2";
		}
		else {
			std::cout << "Using shared header/body" << std::endl;
			cfg["views"]["skins"][0]="tc_skin_a";
			cfg["views"]["skins"][1]="tc_skin_b";
			cfg["views"]["skins"][2]="tc_skin";
		}
		cfg["views"]["default_skin"]="tc_skin";
		cfg["cache"]["backend"]="thread_shared";
		cfg["cache"]["limit"]=100;
		cppcms::service srv(cfg);
		test_app app(srv);

		app.test_buffer();

		app.set_context();

		app.test_skins();
		app.test_views();
		app.test_templates();
		app.test_if();
		app.test_url();
		app.test_foreach();
		app.test_format();
		app.test_forms();
		app.test_block_filter();
		app.test_cache();
		app.test_using_render();
		app.test_gettext();
		if(separate) {
			app.test_using_from();
			app.test_domain();
		}
	}
	catch(std::exception const &e)
	{
		std::cerr << "Fail " << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}